

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

array<int,_8UL> *
dgrminer::flipAdjacencyInfo(array<int,_8UL> *__return_storage_ptr__,array<int,_8UL> *adjacencyinfo)

{
  int iVar1;
  reference pvVar2;
  array<int,_8UL> *newadjacencyinfo;
  array<int,_8UL> *adjacencyinfo_local;
  
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,5);
  __return_storage_ptr__->_M_elems[0] = *pvVar2;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,6);
  __return_storage_ptr__->_M_elems[1] = *pvVar2;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,2);
  iVar1 = flipDirection(*pvVar2);
  __return_storage_ptr__->_M_elems[2] = iVar1;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,3);
  __return_storage_ptr__->_M_elems[3] = *pvVar2;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,4);
  __return_storage_ptr__->_M_elems[4] = *pvVar2;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,0);
  __return_storage_ptr__->_M_elems[5] = *pvVar2;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,1);
  __return_storage_ptr__->_M_elems[6] = *pvVar2;
  pvVar2 = std::array<int,_8UL>::operator[](adjacencyinfo,7);
  __return_storage_ptr__->_M_elems[7] = *pvVar2;
  return __return_storage_ptr__;
}

Assistant:

std::array<int, 8> flipAdjacencyInfo(std::array<int, 8> &adjacencyinfo)
    {
        // flips src-label with dst-label, src-changetime with dst-changetime, and direction
        std::array<int, 8> newadjacencyinfo = {adjacencyinfo[5], adjacencyinfo[6],
                                               flipDirection(adjacencyinfo[2]), adjacencyinfo[3], adjacencyinfo[4],
                                               adjacencyinfo[0], adjacencyinfo[1], adjacencyinfo[7]};
        return newadjacencyinfo;
    }